

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O0

bool move_prog_mudschool_key(ROOM_INDEX_DATA *room,CHAR_DATA *ch,int dir)

{
  long lVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  __type_conflict2 _Var2;
  bool found;
  OBJ_DATA *obj;
  EXIT_DATA *exit;
  void *in_stack_ffffffffffffffb8;
  void *arg1;
  undefined7 in_stack_ffffffffffffffc8;
  byte bVar3;
  char *format;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  lVar1 = *(long *)(in_RDI + 0x38 + (long)in_EDX * 8);
  bVar3 = 0;
  format = *(char **)(in_RSI + 0x98);
  do {
    if (format == (char *)0x0) {
LAB_006bdec0:
      arg1 = *(void **)(lVar1 + 8);
      _Var2 = std::pow<int,int>(0,0x6bdedd);
      if (((ulong)arg1 & (long)_Var2) == 0) {
        _Var2 = std::pow<int,int>(0,0x6bdf09);
        *(ulong *)(lVar1 + 8) = (long)_Var2 | *(ulong *)(lVar1 + 8);
        _Var2 = std::pow<int,int>(0,0x6bdf27);
        *(ulong *)(lVar1 + 8) = (long)_Var2 | *(ulong *)(lVar1 + 8);
        if ((bVar3 & 1) != 0) {
          act(format,(CHAR_DATA *)CONCAT17(bVar3,in_stack_ffffffffffffffc8),arg1,
              in_stack_ffffffffffffffb8,0);
          obj_from_char((OBJ_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
          extract_obj((OBJ_DATA *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        }
        if (*(long *)(in_RDI + 0x18) != 0) {
          act(format,(CHAR_DATA *)CONCAT17(bVar3,in_stack_ffffffffffffffc8),arg1,
              in_stack_ffffffffffffffb8,0);
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
      return local_1;
    }
    if (*(short *)(*(long *)(format + 0x50) + 0x50) == 0x6014) {
      bVar3 = 1;
      goto LAB_006bdec0;
    }
    format = *(char **)format;
  } while( true );
}

Assistant:

bool move_prog_mudschool_key(ROOM_INDEX_DATA *room, CHAR_DATA *ch, int dir)
{
	EXIT_DATA *exit = room->exit[dir];
	OBJ_DATA *obj;
	bool found= false;

	for (obj = ch->carrying; obj != nullptr; obj = obj->next)
	{
		if (obj->pIndexData->vnum == 24596)
		{
			found = true;
			break;
		}
	}

	if (IS_SET(exit->exit_info, EX_CLOSED))
		return false;

	SET_BIT(exit->exit_info, EX_CLOSED);
	SET_BIT(exit->exit_info, EX_LOCKED);

	if (found)
	{
		act("As you pass through the door, $p crumbles to dust.", ch, obj, 0, TO_CHAR);
		obj_from_char(obj);
		extract_obj(obj);
	}

	if (room->people)
		act("The eastern door slams shut.", room->people, 0, 0, TO_ROOM);

	return true;
}